

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O2

void unpackFile(string *cpioArchivePath,string *filename)

{
  bool bVar1;
  __type _Var2;
  ssize_t sVar3;
  size_t sVar4;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  CpioException *pCVar5;
  ulong __n;
  __array cFilename;
  DescriptorWrapper fd;
  allocator<char> local_71;
  string filenameFromArchive;
  header_old_cpio header;
  
  DescriptorWrapper::openFile(&fd,cpioArchivePath,0);
  while( true ) {
    sVar3 = DescriptorWrapper::readTo(&fd,&header,0x1a);
    if (sVar3 == 0) {
      pCVar5 = (CpioException *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filenameFromArchive,"Unexpected EOF",(allocator<char> *)&cFilename);
      CpioException::CpioException(pCVar5,InvalidInputArchive,&filenameFromArchive);
      __cxa_throw(pCVar5,&CpioException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = isHeaderLittleEndian(&header);
    if (bVar1) {
      switchEndianness(&header);
    }
    sVar4 = getFilenameSizeFromBigEndianHeader(&header);
    __n = ((uint)sVar4 & 1) + sVar4;
    __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(__n);
    memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    cFilename._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    DescriptorWrapper::readTo
              (&fd,(void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filenameFromArchive,
               (char *)cFilename._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                       .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,&local_71);
    bVar1 = std::operator==(&filenameFromArchive,"TRAILER!!!");
    if (bVar1) break;
    _Var2 = std::operator==(&filenameFromArchive,filename);
    if (_Var2) {
      unpackFileInternal(&header,&fd,&filenameFromArchive);
      std::__cxx11::string::~string((string *)&filenameFromArchive);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&cFilename);
      DescriptorWrapper::~DescriptorWrapper(&fd);
      return;
    }
    sVar4 = getFileSizeFromBigEndianHeader(&header);
    DescriptorWrapper::seek(&fd,((uint)sVar4 & 1) + sVar4,1);
    std::__cxx11::string::~string((string *)&filenameFromArchive);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&cFilename);
  }
  std::__cxx11::string::~string((string *)&filenameFromArchive);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&cFilename);
  pCVar5 = (CpioException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filenameFromArchive,"Couldn\'t find specified file in archive",
             (allocator<char> *)&cFilename);
  CpioException::CpioException(pCVar5,FileNotFoundInArchive,&filenameFromArchive);
  __cxa_throw(pCVar5,&CpioException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void unpackFile(const string& cpioArchivePath, const string& filename) 
{
	ssize_t sz = -1;
	header_old_cpio header;


	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);

		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filenameFromArchive(cFilename.get());
		if (filenameFromArchive == "TRAILER!!!") {
			break;
		}
		else if (filenameFromArchive == filename) {
			unpackFileInternal(header, fd, filenameFromArchive);
			return;
		}

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	throw CpioException(CpioException::FileNotFoundInArchive, "Couldn't find specified file in archive");
	return;
}